

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O2

Path * Pathie::Path::home(void)

{
  char *pcVar1;
  runtime_error *this;
  Path *in_RDI;
  allocator local_59;
  string local_58;
  string local_38;
  
  pcVar1 = getenv("HOME");
  if (pcVar1 != (char *)0x0) {
    std::__cxx11::string::string((string *)&local_58,pcVar1,&local_59);
    filename_to_utf8(&local_38,&local_58);
    Path(in_RDI,&local_38);
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
    return in_RDI;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string((string *)&local_58,"$HOME not defined.",&local_59);
  std::runtime_error::runtime_error(this,(string *)&local_58);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Path Path::home()
{
#if defined(_PATHIE_UNIX)
  char* homedir = getenv("HOME");
  if (homedir)
    return Path(filename_to_utf8(homedir));
  else
    throw(std::runtime_error("$HOME not defined."));
#elif defined(_WIN32)
  /* TODO: Switch to KNOWNFOLDERID system as explained
   * on http://msdn.microsoft.com/en-us/library/windows/desktop/bb762494%28v=vs.85%29.aspx
   * and http://msdn.microsoft.com/en-us/library/windows/desktop/bb762181%28v=vs.85%29.aspx
   *. Howevever, MinGW does currently (September 2014) not have
   * the new KNOWNFOLDERID declarations.
   */

  wchar_t homedir[MAX_PATH];
  if (SHGetFolderPathW(NULL, CSIDL_PROFILE, NULL, SHGFP_TYPE_CURRENT, homedir) != S_OK)
    throw(std::runtime_error("Home directory not defined."));

  return Path(utf16_to_utf8(homedir));
#else
#error Unsupported system.
#endif
}